

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O0

int x509_get_hash_alg(mbedtls_x509_buf *alg,mbedtls_md_type_t *md_alg)

{
  int iVar1;
  size_t local_58;
  size_t len;
  mbedtls_x509_buf md_oid;
  uchar *end;
  uchar *p;
  mbedtls_md_type_t *pmStack_20;
  int ret;
  mbedtls_md_type_t *md_alg_local;
  mbedtls_x509_buf *alg_local;
  
  if (alg->tag == 0x30) {
    end = alg->p;
    md_oid.p = end + alg->len;
    if (end < md_oid.p) {
      len._0_4_ = (uint)*end;
      pmStack_20 = md_alg;
      md_alg_local = (mbedtls_md_type_t *)alg;
      p._4_4_ = mbedtls_asn1_get_tag(&end,md_oid.p,(size_t *)&md_oid,6);
      if (p._4_4_ == 0) {
        md_oid.len = (size_t)end;
        end = end + md_oid._0_8_;
        p._4_4_ = mbedtls_oid_get_md_alg((mbedtls_asn1_buf *)&len,pmStack_20);
        if (p._4_4_ == 0) {
          if (end == md_oid.p) {
            alg_local._4_4_ = 0;
          }
          else {
            iVar1 = mbedtls_asn1_get_tag(&end,md_oid.p,&local_58,5);
            if ((iVar1 == 0) && (local_58 == 0)) {
              if (end == md_oid.p) {
                alg_local._4_4_ = 0;
              }
              else {
                alg_local._4_4_ = -0x2366;
              }
            }
            else {
              alg_local._4_4_ = iVar1 + -0x2300;
            }
          }
        }
        else {
          alg_local._4_4_ = p._4_4_ + -0x2300;
        }
      }
      else {
        alg_local._4_4_ = p._4_4_ + -0x2300;
      }
    }
    else {
      alg_local._4_4_ = -0x2360;
    }
  }
  else {
    alg_local._4_4_ = -0x2362;
  }
  return alg_local._4_4_;
}

Assistant:

static int x509_get_hash_alg( const mbedtls_x509_buf *alg, mbedtls_md_type_t *md_alg )
{
    int ret;
    unsigned char *p;
    const unsigned char *end;
    mbedtls_x509_buf md_oid;
    size_t len;

    /* Make sure we got a SEQUENCE and setup bounds */
    if( alg->tag != ( MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) )
        return( MBEDTLS_ERR_X509_INVALID_ALG +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    p = (unsigned char *) alg->p;
    end = p + alg->len;

    if( p >= end )
        return( MBEDTLS_ERR_X509_INVALID_ALG +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    /* Parse md_oid */
    md_oid.tag = *p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &md_oid.len, MBEDTLS_ASN1_OID ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    md_oid.p = p;
    p += md_oid.len;

    /* Get md_alg from md_oid */
    if( ( ret = mbedtls_oid_get_md_alg( &md_oid, md_alg ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    /* Make sure params is absent of NULL */
    if( p == end )
        return( 0 );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len, MBEDTLS_ASN1_NULL ) ) != 0 || len != 0 )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    if( p != end )
        return( MBEDTLS_ERR_X509_INVALID_ALG +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}